

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureMipmapTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Functional::Texture3DLodControlCase::init
          (Texture3DLodControlCase *this,EVP_PKEY_CTX *ctx)

{
  uint depth;
  pointer pPVar1;
  uint uVar2;
  uint uVar3;
  int extraout_EAX;
  Texture3D *this_00;
  uint uVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  RGBA local_b4;
  ulong local_b0;
  TextureFormat local_a8;
  Vector<float,_4> local_a0;
  tcu local_90 [16];
  tcu local_80 [16];
  TextureFormatInfo fmtInfo;
  
  local_a8 = glu::mapGLInternalFormat(0x8058);
  tcu::getTextureFormatInfo(&fmtInfo,&local_a8);
  uVar4 = this->m_texWidth;
  uVar3 = this->m_texHeight;
  uVar2 = uVar3;
  if ((int)uVar3 < (int)uVar4) {
    uVar2 = uVar4;
  }
  depth = this->m_texDepth;
  if ((int)uVar2 <= (int)depth) {
    uVar2 = depth;
  }
  if (uVar2 == 0) {
    uVar6 = 0x20;
  }
  else {
    uVar6 = 0x1f;
    if (uVar2 != 0) {
      for (; uVar2 >> uVar6 == 0; uVar6 = uVar6 - 1) {
      }
    }
    uVar6 = uVar6 ^ 0x1f;
  }
  this_00 = (Texture3D *)operator_new(0x70);
  glu::Texture3D::Texture3D
            (this_00,((this->super_TestCase).m_context)->m_renderCtx,0x8058,uVar4,uVar3,depth);
  this->m_texture = this_00;
  local_b0 = (ulong)(0x20 - uVar6);
  lVar5 = 0;
  for (uVar7 = 0; local_b0 != uVar7; uVar7 = uVar7 + 1) {
    uVar3 = (int)(0xff / (long)(int)(0x1f - uVar6)) * (int)uVar7;
    uVar4 = 0xff;
    if (uVar3 < 0xff) {
      uVar4 = uVar3;
    }
    uVar4 = uVar4 * 0x10100 ^ 0xff00ffff;
    if ((int)uVar3 < 0) {
      uVar4 = 0xff00ffff;
    }
    tcu::Texture3D::allocLevel(&this->m_texture->m_refTexture,(int)uVar7);
    pPVar1 = (this->m_texture->m_refTexture).super_TextureLevelPyramid.m_access.
             super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
             _M_impl.super__Vector_impl_data._M_start;
    local_b4.m_value = uVar4;
    tcu::RGBA::toVec(&local_b4);
    tcu::operator*(local_90,&local_a0,&fmtInfo.lookupScale);
    tcu::operator+(local_80,(Vector<float,_4> *)local_90,&fmtInfo.lookupBias);
    tcu::clear((PixelBufferAccess *)
               ((long)(pPVar1->super_ConstPixelBufferAccess).m_size.m_data + lVar5 + -8),
               (Vec4 *)local_80);
    lVar5 = lVar5 + 0x28;
  }
  glu::Texture3D::upload(this->m_texture);
  return extraout_EAX;
}

Assistant:

void Texture3DLodControlCase::init (void)
{
	const deUint32					format			= GL_RGBA8;
	const tcu::TextureFormat&		texFmt			= glu::mapGLInternalFormat(format);
	tcu::TextureFormatInfo			fmtInfo			= tcu::getTextureFormatInfo(texFmt);
	const tcu::Vec4&				cScale			= fmtInfo.lookupScale;
	const tcu::Vec4&				cBias			= fmtInfo.lookupBias;
	int								numLevels		= deLog2Floor32(de::max(de::max(m_texWidth, m_texHeight), m_texDepth))+1;

	m_texture = new glu::Texture3D(m_context.getRenderContext(), format, m_texWidth, m_texHeight, m_texDepth);

	// Fill texture with colored grid.
	for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
	{
		deUint32	step		= 0xff / (numLevels-1);
		deUint32	inc			= deClamp32(step*levelNdx, 0x00, 0xff);
		deUint32	dec			= 0xff - inc;
		deUint32	rgb			= (inc << 16) | (dec << 8) | 0xff;
		deUint32	color		= 0xff000000 | rgb;

		m_texture->getRefTexture().allocLevel(levelNdx);
		tcu::clear(m_texture->getRefTexture().getLevel(levelNdx), tcu::RGBA(color).toVec()*cScale + cBias);
	}

	m_texture->upload();
}